

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

int cmp(void *param_1,void *param_2)

{
  int iVar1;
  uint *puVar2;
  int j;
  int i;
  uint32 *xb0;
  uint32 *xb;
  uint32 *xa0;
  uint32 *xa;
  Bigint *b_local;
  Bigint *a_local;
  
  iVar1 = *(int *)((long)param_2 + 0x14);
  a_local._4_4_ = *(int *)((long)param_1 + 0x14) - iVar1;
  if (a_local._4_4_ == 0) {
    xb0 = (uint32 *)((long)param_2 + (long)iVar1 * 4 + 0x18);
    xa0 = (uint *)((long)param_1 + 0x18) + iVar1;
    do {
      puVar2 = xa0 + -1;
      if (xa0[-1] != xb0[-1]) {
        if (xb0[-1] <= *puVar2) {
          return 1;
        }
        return -1;
      }
      xb0 = xb0 + -1;
      xa0 = puVar2;
    } while ((uint *)((long)param_1 + 0x18) < puVar2);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
cmp(Bigint *a, Bigint *b)
{
    ULong *xa, *xa0, *xb, *xb0;
    int i, j;

    i = a->wds;
    j = b->wds;
#ifdef DEBUG
    if (i > 1 && !a->x[i-1])
        Bug("cmp called with a->x[a->wds-1] == 0");
    if (j > 1 && !b->x[j-1])
        Bug("cmp called with b->x[b->wds-1] == 0");
#endif
    if (i -= j)
        return i;
    xa0 = a->x;
    xa = xa0 + j;
    xb0 = b->x;
    xb = xb0 + j;
    for(;;) {
        if (*--xa != *--xb)
            return *xa < *xb ? -1 : 1;
        if (xa <= xa0)
            break;
    }
    return 0;
}